

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_luma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  UWORD8 *pUVar12;
  UWORD8 *pUVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar42 [16];
  undefined1 auVar51 [16];
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar74 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar93 [16];
  undefined1 auVar102 [16];
  undefined1 auVar34 [16];
  undefined1 auVar43 [16];
  undefined1 auVar52 [16];
  undefined1 auVar61 [16];
  undefined1 auVar35 [16];
  undefined1 auVar44 [16];
  undefined1 auVar53 [16];
  undefined1 auVar62 [16];
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar54 [16];
  undefined1 auVar63 [16];
  undefined1 auVar69 [16];
  undefined1 auVar37 [16];
  undefined1 auVar46 [16];
  undefined1 auVar55 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar56 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar57 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar58 [16];
  undefined1 auVar41 [16];
  undefined1 auVar50 [16];
  undefined1 auVar59 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar85 [16];
  undefined1 auVar94 [16];
  undefined1 auVar76 [16];
  undefined1 auVar86 [16];
  undefined1 auVar95 [16];
  undefined1 auVar77 [16];
  undefined1 auVar87 [16];
  undefined1 auVar96 [16];
  undefined1 auVar78 [16];
  undefined1 auVar88 [16];
  undefined1 auVar97 [16];
  undefined1 auVar79 [16];
  undefined1 auVar89 [16];
  undefined1 auVar98 [16];
  undefined1 auVar80 [16];
  undefined1 auVar90 [16];
  undefined1 auVar99 [16];
  undefined1 auVar81 [16];
  undefined1 auVar91 [16];
  undefined1 auVar100 [16];
  undefined1 auVar82 [16];
  undefined1 auVar92 [16];
  undefined1 auVar101 [16];
  
  auVar11 = _DAT_0016b520;
  auVar10 = _DAT_0016b510;
  auVar9 = _DAT_0016b500;
  if ((wd & 3U) == 0) {
    iVar14 = src_strd * 2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)pi1_coeff;
    auVar19 = pshuflw(in_XMM1,auVar18,0);
    auVar19._4_4_ = auVar19._0_4_;
    auVar19._8_4_ = auVar19._0_4_;
    auVar19._12_4_ = auVar19._0_4_;
    auVar20 = pshuflw(in_XMM2,auVar18,0x55);
    auVar20._4_4_ = auVar20._0_4_;
    auVar20._8_4_ = auVar20._0_4_;
    auVar20._12_4_ = auVar20._0_4_;
    auVar21 = pshuflw(in_XMM3,auVar18,0xaa);
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar18 = pshufb(auVar18,_DAT_0016b4f0);
    if ((ht & 1U) == 0) {
      iVar16 = dst_strd * 2;
      if ((wd & 4U) == 0) {
        pUVar12 = pu1_dst + dst_strd;
        pUVar13 = pu1_src + (long)src_strd + -3;
        iVar15 = 0;
        auVar22 = pmovsxbw(in_XMM7,0x2020202020202020);
        for (; iVar15 < ht; iVar15 = iVar15 + 2) {
          for (lVar17 = 0; (int)lVar17 < wd; lVar17 = lVar17 + 8) {
            auVar27 = *(undefined1 (*) [16])(pu1_src + lVar17 + -3);
            auVar29 = *(undefined1 (*) [16])(pUVar13 + lVar17);
            auVar82._0_14_ = auVar27._0_14_;
            auVar82[0xe] = auVar27[7];
            auVar82[0xf] = auVar27[8];
            auVar81._14_2_ = auVar82._14_2_;
            auVar81._0_13_ = auVar27._0_13_;
            auVar81[0xd] = auVar27[7];
            auVar80._13_3_ = auVar81._13_3_;
            auVar80._0_12_ = auVar27._0_12_;
            auVar80[0xc] = auVar27[6];
            auVar79._12_4_ = auVar80._12_4_;
            auVar79._0_11_ = auVar27._0_11_;
            auVar79[0xb] = auVar27[6];
            auVar78._11_5_ = auVar79._11_5_;
            auVar78._0_10_ = auVar27._0_10_;
            auVar78[10] = auVar27[5];
            auVar77._10_6_ = auVar78._10_6_;
            auVar77._0_9_ = auVar27._0_9_;
            auVar77[9] = auVar27[5];
            auVar76._9_7_ = auVar77._9_7_;
            auVar76._0_8_ = auVar27._0_8_;
            auVar76[8] = auVar27[4];
            auVar75._8_8_ = auVar76._8_8_;
            auVar75[7] = auVar27[4];
            auVar75[6] = auVar27[3];
            auVar75[5] = auVar27[3];
            auVar75[4] = auVar27[2];
            auVar75[3] = auVar27[2];
            auVar74._0_2_ = auVar27._0_2_;
            auVar75[2] = auVar27[1];
            auVar75._0_2_ = auVar74._0_2_;
            auVar74._2_14_ = auVar75._2_14_;
            auVar83 = pmaddubsw(auVar74,auVar19);
            auVar32 = pshufb(auVar27,auVar9);
            auVar32 = pmaddubsw(auVar32,auVar20);
            auVar102 = pshufb(auVar27,auVar10);
            auVar102 = pmaddubsw(auVar102,auVar21);
            auVar27 = pshufb(auVar27,auVar11);
            auVar27 = pmaddubsw(auVar27,auVar18);
            auVar28._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
            auVar28._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
            auVar28._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
            auVar28._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
            auVar28._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
            auVar28._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
            auVar28._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
            auVar28._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
            auVar27 = paddsw(auVar28,auVar22);
            auVar27 = psraw(auVar27,6);
            sVar1 = auVar27._0_2_;
            sVar2 = auVar27._2_2_;
            sVar3 = auVar27._4_2_;
            sVar4 = auVar27._6_2_;
            sVar5 = auVar27._8_2_;
            sVar6 = auVar27._10_2_;
            sVar7 = auVar27._12_2_;
            sVar8 = auVar27._14_2_;
            *(ulong *)(pu1_dst + lVar17) =
                 CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xe] - (0xff < sVar8),
                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar27[0xc] - (0xff < sVar7),
                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar27[10] -
                                            (0xff < sVar6),
                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar27[8] -
                                                     (0xff < sVar5),
                                                     CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                              auVar27[6] - (0xff < sVar4),
                                                              CONCAT12((0 < sVar3) * (sVar3 < 0x100)
                                                                       * auVar27[4] - (0xff < sVar3)
                                                                       ,CONCAT11((0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar27[2] -
                                                                                 (0xff < sVar2),
                                                                                 (0 < sVar1) *
                                                                                 (sVar1 < 0x100) *
                                                                                 auVar27[0] -
                                                                                 (0xff < sVar1))))))
                                  ));
            auVar41._0_14_ = auVar29._0_14_;
            auVar41[0xe] = auVar29[7];
            auVar41[0xf] = auVar29[8];
            auVar40._14_2_ = auVar41._14_2_;
            auVar40._0_13_ = auVar29._0_13_;
            auVar40[0xd] = auVar29[7];
            auVar39._13_3_ = auVar40._13_3_;
            auVar39._0_12_ = auVar29._0_12_;
            auVar39[0xc] = auVar29[6];
            auVar38._12_4_ = auVar39._12_4_;
            auVar38._0_11_ = auVar29._0_11_;
            auVar38[0xb] = auVar29[6];
            auVar37._11_5_ = auVar38._11_5_;
            auVar37._0_10_ = auVar29._0_10_;
            auVar37[10] = auVar29[5];
            auVar36._10_6_ = auVar37._10_6_;
            auVar36._0_9_ = auVar29._0_9_;
            auVar36[9] = auVar29[5];
            auVar35._9_7_ = auVar36._9_7_;
            auVar35._0_8_ = auVar29._0_8_;
            auVar35[8] = auVar29[4];
            auVar34._8_8_ = auVar35._8_8_;
            auVar34[7] = auVar29[4];
            auVar34[6] = auVar29[3];
            auVar34[5] = auVar29[3];
            auVar34[4] = auVar29[2];
            auVar34[3] = auVar29[2];
            auVar33._0_2_ = auVar29._0_2_;
            auVar34[2] = auVar29[1];
            auVar34._0_2_ = auVar33._0_2_;
            auVar33._2_14_ = auVar34._2_14_;
            auVar83 = pmaddubsw(auVar33,auVar19);
            auVar27 = pshufb(auVar29,auVar9);
            auVar32 = pmaddubsw(auVar27,auVar20);
            auVar27 = pshufb(auVar29,auVar10);
            auVar102 = pmaddubsw(auVar27,auVar21);
            auVar27 = pshufb(auVar29,auVar11);
            auVar27 = pmaddubsw(auVar27,auVar18);
            auVar23._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
            auVar23._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
            auVar23._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
            auVar23._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
            auVar23._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
            auVar23._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
            auVar23._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
            auVar23._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
            auVar27 = paddsw(auVar23,auVar22);
            auVar27 = psraw(auVar27,6);
            sVar1 = auVar27._0_2_;
            sVar2 = auVar27._2_2_;
            sVar3 = auVar27._4_2_;
            sVar4 = auVar27._6_2_;
            sVar5 = auVar27._8_2_;
            sVar6 = auVar27._10_2_;
            sVar7 = auVar27._12_2_;
            sVar8 = auVar27._14_2_;
            *(ulong *)(pUVar12 + lVar17) =
                 CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xe] - (0xff < sVar8),
                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar27[0xc] - (0xff < sVar7),
                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar27[10] -
                                            (0xff < sVar6),
                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar27[8] -
                                                     (0xff < sVar5),
                                                     CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                              auVar27[6] - (0xff < sVar4),
                                                              CONCAT12((0 < sVar3) * (sVar3 < 0x100)
                                                                       * auVar27[4] - (0xff < sVar3)
                                                                       ,CONCAT11((0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar27[2] -
                                                                                 (0xff < sVar2),
                                                                                 (0 < sVar1) *
                                                                                 (sVar1 < 0x100) *
                                                                                 auVar27[0] -
                                                                                 (0xff < sVar1))))))
                                  ));
          }
          pu1_src = pu1_src + iVar14;
          pu1_dst = pu1_dst + iVar16;
          pUVar12 = pUVar12 + iVar16;
          pUVar13 = pUVar13 + iVar14;
        }
      }
      else {
        pUVar12 = pu1_dst + dst_strd;
        pUVar13 = pu1_src + (long)src_strd + -3;
        iVar15 = 0;
        auVar22 = pmovsxbw(in_XMM7,0x2020202020202020);
        for (; iVar15 < ht; iVar15 = iVar15 + 2) {
          for (lVar17 = 0; (int)lVar17 < wd; lVar17 = lVar17 + 4) {
            auVar27 = *(undefined1 (*) [16])(pu1_src + lVar17 + -3);
            auVar29 = *(undefined1 (*) [16])(pUVar13 + lVar17);
            auVar92._0_14_ = auVar27._0_14_;
            auVar92[0xe] = auVar27[7];
            auVar92[0xf] = auVar27[8];
            auVar91._14_2_ = auVar92._14_2_;
            auVar91._0_13_ = auVar27._0_13_;
            auVar91[0xd] = auVar27[7];
            auVar90._13_3_ = auVar91._13_3_;
            auVar90._0_12_ = auVar27._0_12_;
            auVar90[0xc] = auVar27[6];
            auVar89._12_4_ = auVar90._12_4_;
            auVar89._0_11_ = auVar27._0_11_;
            auVar89[0xb] = auVar27[6];
            auVar88._11_5_ = auVar89._11_5_;
            auVar88._0_10_ = auVar27._0_10_;
            auVar88[10] = auVar27[5];
            auVar87._10_6_ = auVar88._10_6_;
            auVar87._0_9_ = auVar27._0_9_;
            auVar87[9] = auVar27[5];
            auVar86._9_7_ = auVar87._9_7_;
            auVar86._0_8_ = auVar27._0_8_;
            auVar86[8] = auVar27[4];
            auVar85._8_8_ = auVar86._8_8_;
            auVar85[7] = auVar27[4];
            auVar85[6] = auVar27[3];
            auVar85[5] = auVar27[3];
            auVar85[4] = auVar27[2];
            auVar85[3] = auVar27[2];
            auVar84._0_2_ = auVar27._0_2_;
            auVar85[2] = auVar27[1];
            auVar85._0_2_ = auVar84._0_2_;
            auVar84._2_14_ = auVar85._2_14_;
            auVar83 = pmaddubsw(auVar84,auVar19);
            auVar32 = pshufb(auVar27,auVar9);
            auVar32 = pmaddubsw(auVar32,auVar20);
            auVar102 = pshufb(auVar27,auVar10);
            auVar102 = pmaddubsw(auVar102,auVar21);
            auVar27 = pshufb(auVar27,auVar11);
            auVar27 = pmaddubsw(auVar27,auVar18);
            auVar30._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
            auVar30._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
            auVar30._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
            auVar30._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
            auVar30._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
            auVar30._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
            auVar30._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
            auVar30._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
            auVar27 = paddsw(auVar30,auVar22);
            auVar27 = psraw(auVar27,6);
            sVar1 = auVar27._0_2_;
            sVar2 = auVar27._2_2_;
            sVar3 = auVar27._4_2_;
            sVar4 = auVar27._6_2_;
            *(ulong *)(pu1_dst + lVar17) =
                 *(ulong *)(pu1_dst + lVar17) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar27[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar27[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar27[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar27[0] -
                                                   (0xff < sVar1))));
            auVar59._0_14_ = auVar29._0_14_;
            auVar59[0xe] = auVar29[7];
            auVar59[0xf] = auVar29[8];
            auVar58._14_2_ = auVar59._14_2_;
            auVar58._0_13_ = auVar29._0_13_;
            auVar58[0xd] = auVar29[7];
            auVar57._13_3_ = auVar58._13_3_;
            auVar57._0_12_ = auVar29._0_12_;
            auVar57[0xc] = auVar29[6];
            auVar56._12_4_ = auVar57._12_4_;
            auVar56._0_11_ = auVar29._0_11_;
            auVar56[0xb] = auVar29[6];
            auVar55._11_5_ = auVar56._11_5_;
            auVar55._0_10_ = auVar29._0_10_;
            auVar55[10] = auVar29[5];
            auVar54._10_6_ = auVar55._10_6_;
            auVar54._0_9_ = auVar29._0_9_;
            auVar54[9] = auVar29[5];
            auVar53._9_7_ = auVar54._9_7_;
            auVar53._0_8_ = auVar29._0_8_;
            auVar53[8] = auVar29[4];
            auVar52._8_8_ = auVar53._8_8_;
            auVar52[7] = auVar29[4];
            auVar52[6] = auVar29[3];
            auVar52[5] = auVar29[3];
            auVar52[4] = auVar29[2];
            auVar52[3] = auVar29[2];
            auVar51._0_2_ = auVar29._0_2_;
            auVar52[2] = auVar29[1];
            auVar52._0_2_ = auVar51._0_2_;
            auVar51._2_14_ = auVar52._2_14_;
            auVar83 = pmaddubsw(auVar51,auVar19);
            auVar27 = pshufb(auVar29,auVar9);
            auVar32 = pmaddubsw(auVar27,auVar20);
            auVar27 = pshufb(auVar29,auVar10);
            auVar102 = pmaddubsw(auVar27,auVar21);
            auVar27 = pshufb(auVar29,auVar11);
            auVar27 = pmaddubsw(auVar27,auVar18);
            auVar25._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
            auVar25._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
            auVar25._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
            auVar25._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
            auVar25._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
            auVar25._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
            auVar25._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
            auVar25._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
            auVar27 = paddsw(auVar25,auVar22);
            auVar27 = psraw(auVar27,6);
            sVar1 = auVar27._0_2_;
            sVar2 = auVar27._2_2_;
            sVar3 = auVar27._4_2_;
            sVar4 = auVar27._6_2_;
            *(ulong *)(pUVar12 + lVar17) =
                 *(ulong *)(pUVar12 + lVar17) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar27[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar27[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar27[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar27[0] -
                                                   (0xff < sVar1))));
          }
          pu1_src = pu1_src + iVar14;
          pu1_dst = pu1_dst + iVar16;
          pUVar12 = pUVar12 + iVar16;
          pUVar13 = pUVar13 + iVar14;
        }
      }
    }
    else if ((wd & 4U) == 0) {
      iVar14 = 0;
      if (ht < 1) {
        ht = 0;
      }
      auVar22 = pmovsxbw(in_XMM7,0x2020202020202020);
      for (; iVar14 != ht; iVar14 = iVar14 + 1) {
        for (lVar17 = 0; (int)lVar17 < wd; lVar17 = lVar17 + 8) {
          auVar27 = *(undefined1 (*) [16])(pu1_src + lVar17 + -3);
          auVar50._0_14_ = auVar27._0_14_;
          auVar50[0xe] = auVar27[7];
          auVar50[0xf] = auVar27[8];
          auVar49._14_2_ = auVar50._14_2_;
          auVar49._0_13_ = auVar27._0_13_;
          auVar49[0xd] = auVar27[7];
          auVar48._13_3_ = auVar49._13_3_;
          auVar48._0_12_ = auVar27._0_12_;
          auVar48[0xc] = auVar27[6];
          auVar47._12_4_ = auVar48._12_4_;
          auVar47._0_11_ = auVar27._0_11_;
          auVar47[0xb] = auVar27[6];
          auVar46._11_5_ = auVar47._11_5_;
          auVar46._0_10_ = auVar27._0_10_;
          auVar46[10] = auVar27[5];
          auVar45._10_6_ = auVar46._10_6_;
          auVar45._0_9_ = auVar27._0_9_;
          auVar45[9] = auVar27[5];
          auVar44._9_7_ = auVar45._9_7_;
          auVar44._0_8_ = auVar27._0_8_;
          auVar44[8] = auVar27[4];
          auVar43._8_8_ = auVar44._8_8_;
          auVar43[7] = auVar27[4];
          auVar43[6] = auVar27[3];
          auVar43[5] = auVar27[3];
          auVar43[4] = auVar27[2];
          auVar43[3] = auVar27[2];
          auVar42._0_2_ = auVar27._0_2_;
          auVar43[2] = auVar27[1];
          auVar43._0_2_ = auVar42._0_2_;
          auVar42._2_14_ = auVar43._2_14_;
          auVar32 = pmaddubsw(auVar42,auVar19);
          auVar29 = pshufb(auVar27,auVar9);
          auVar29 = pmaddubsw(auVar29,auVar20);
          auVar83 = pshufb(auVar27,auVar10);
          auVar83 = pmaddubsw(auVar83,auVar21);
          auVar27 = pshufb(auVar27,auVar11);
          auVar27 = pmaddubsw(auVar27,auVar18);
          auVar24._0_2_ = auVar27._0_2_ + auVar83._0_2_ + auVar29._0_2_ + auVar32._0_2_;
          auVar24._2_2_ = auVar27._2_2_ + auVar83._2_2_ + auVar29._2_2_ + auVar32._2_2_;
          auVar24._4_2_ = auVar27._4_2_ + auVar83._4_2_ + auVar29._4_2_ + auVar32._4_2_;
          auVar24._6_2_ = auVar27._6_2_ + auVar83._6_2_ + auVar29._6_2_ + auVar32._6_2_;
          auVar24._8_2_ = auVar27._8_2_ + auVar83._8_2_ + auVar29._8_2_ + auVar32._8_2_;
          auVar24._10_2_ = auVar27._10_2_ + auVar83._10_2_ + auVar29._10_2_ + auVar32._10_2_;
          auVar24._12_2_ = auVar27._12_2_ + auVar83._12_2_ + auVar29._12_2_ + auVar32._12_2_;
          auVar24._14_2_ = auVar27._14_2_ + auVar83._14_2_ + auVar29._14_2_ + auVar32._14_2_;
          auVar27 = paddsw(auVar24,auVar22);
          auVar27 = psraw(auVar27,6);
          sVar1 = auVar27._0_2_;
          sVar2 = auVar27._2_2_;
          sVar3 = auVar27._4_2_;
          sVar4 = auVar27._6_2_;
          sVar5 = auVar27._8_2_;
          sVar6 = auVar27._10_2_;
          sVar7 = auVar27._12_2_;
          sVar8 = auVar27._14_2_;
          *(ulong *)(pu1_dst + lVar17) =
               CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xe] - (0xff < sVar8),
                        CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar27[0xc] - (0xff < sVar7),
                                 CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar27[10] -
                                          (0xff < sVar6),
                                          CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar27[8] -
                                                   (0xff < sVar5),
                                                   CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                            auVar27[6] - (0xff < sVar4),
                                                            CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                     auVar27[4] - (0xff < sVar3),
                                                                     CONCAT11((0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar27[2] -
                                                                              (0xff < sVar2),
                                                                              (0 < sVar1) *
                                                                              (sVar1 < 0x100) *
                                                                              auVar27[0] -
                                                                              (0xff < sVar1))))))));
        }
        pu1_src = pu1_src + src_strd;
        pu1_dst = pu1_dst + dst_strd;
      }
    }
    else {
      pUVar12 = pu1_dst + dst_strd;
      pUVar13 = pu1_src + (long)src_strd + -3;
      iVar16 = 0;
      auVar22 = pmovsxbw(in_XMM7,0x2020202020202020);
      for (; iVar16 < ht + -1; iVar16 = iVar16 + 2) {
        for (lVar17 = 0; (int)lVar17 < wd; lVar17 = lVar17 + 4) {
          auVar27 = *(undefined1 (*) [16])(pu1_src + lVar17 + -3);
          auVar29 = *(undefined1 (*) [16])(pUVar13 + lVar17);
          auVar101._0_14_ = auVar27._0_14_;
          auVar101[0xe] = auVar27[7];
          auVar101[0xf] = auVar27[8];
          auVar100._14_2_ = auVar101._14_2_;
          auVar100._0_13_ = auVar27._0_13_;
          auVar100[0xd] = auVar27[7];
          auVar99._13_3_ = auVar100._13_3_;
          auVar99._0_12_ = auVar27._0_12_;
          auVar99[0xc] = auVar27[6];
          auVar98._12_4_ = auVar99._12_4_;
          auVar98._0_11_ = auVar27._0_11_;
          auVar98[0xb] = auVar27[6];
          auVar97._11_5_ = auVar98._11_5_;
          auVar97._0_10_ = auVar27._0_10_;
          auVar97[10] = auVar27[5];
          auVar96._10_6_ = auVar97._10_6_;
          auVar96._0_9_ = auVar27._0_9_;
          auVar96[9] = auVar27[5];
          auVar95._9_7_ = auVar96._9_7_;
          auVar95._0_8_ = auVar27._0_8_;
          auVar95[8] = auVar27[4];
          auVar94._8_8_ = auVar95._8_8_;
          auVar94[7] = auVar27[4];
          auVar94[6] = auVar27[3];
          auVar94[5] = auVar27[3];
          auVar94[4] = auVar27[2];
          auVar94[3] = auVar27[2];
          auVar93._0_2_ = auVar27._0_2_;
          auVar94[2] = auVar27[1];
          auVar94._0_2_ = auVar93._0_2_;
          auVar93._2_14_ = auVar94._2_14_;
          auVar83 = pmaddubsw(auVar93,auVar19);
          auVar32 = pshufb(auVar27,auVar9);
          auVar32 = pmaddubsw(auVar32,auVar20);
          auVar102 = pshufb(auVar27,auVar10);
          auVar102 = pmaddubsw(auVar102,auVar21);
          auVar27 = pshufb(auVar27,auVar11);
          auVar27 = pmaddubsw(auVar27,auVar18);
          auVar31._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
          auVar31._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
          auVar31._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
          auVar31._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
          auVar31._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
          auVar31._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
          auVar31._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
          auVar31._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
          auVar27 = paddsw(auVar31,auVar22);
          auVar27 = psraw(auVar27,6);
          sVar1 = auVar27._0_2_;
          sVar2 = auVar27._2_2_;
          sVar3 = auVar27._4_2_;
          sVar4 = auVar27._6_2_;
          *(ulong *)(pu1_dst + lVar17) =
               *(ulong *)(pu1_dst + lVar17) & 0xffffffff00000000 |
               (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar27[6] - (0xff < sVar4),
                               CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar27[4] - (0xff < sVar3),
                                        CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar27[2] -
                                                 (0xff < sVar2),
                                                 (0 < sVar1) * (sVar1 < 0x100) * auVar27[0] -
                                                 (0xff < sVar1))));
          auVar67._0_14_ = auVar29._0_14_;
          auVar67[0xe] = auVar29[7];
          auVar67[0xf] = auVar29[8];
          auVar27._14_2_ = auVar67._14_2_;
          auVar27._0_13_ = auVar29._0_13_;
          auVar27[0xd] = auVar29[7];
          auVar66._13_3_ = auVar27._13_3_;
          auVar66._0_12_ = auVar29._0_12_;
          auVar66[0xc] = auVar29[6];
          auVar65._12_4_ = auVar66._12_4_;
          auVar65._0_11_ = auVar29._0_11_;
          auVar65[0xb] = auVar29[6];
          auVar64._11_5_ = auVar65._11_5_;
          auVar64._0_10_ = auVar29._0_10_;
          auVar64[10] = auVar29[5];
          auVar63._10_6_ = auVar64._10_6_;
          auVar63._0_9_ = auVar29._0_9_;
          auVar63[9] = auVar29[5];
          auVar62._9_7_ = auVar63._9_7_;
          auVar62._0_8_ = auVar29._0_8_;
          auVar62[8] = auVar29[4];
          auVar61._8_8_ = auVar62._8_8_;
          auVar61[7] = auVar29[4];
          auVar61[6] = auVar29[3];
          auVar61[5] = auVar29[3];
          auVar61[4] = auVar29[2];
          auVar61[3] = auVar29[2];
          auVar60._0_2_ = auVar29._0_2_;
          auVar61[2] = auVar29[1];
          auVar61._0_2_ = auVar60._0_2_;
          auVar60._2_14_ = auVar61._2_14_;
          auVar83 = pmaddubsw(auVar60,auVar19);
          auVar27 = pshufb(auVar29,auVar9);
          auVar32 = pmaddubsw(auVar27,auVar20);
          auVar27 = pshufb(auVar29,auVar10);
          auVar102 = pmaddubsw(auVar27,auVar21);
          auVar27 = pshufb(auVar29,auVar11);
          auVar27 = pmaddubsw(auVar27,auVar18);
          auVar26._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
          auVar26._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
          auVar26._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
          auVar26._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
          auVar26._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
          auVar26._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
          auVar26._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
          auVar26._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
          auVar27 = paddsw(auVar26,auVar22);
          auVar27 = psraw(auVar27,6);
          sVar1 = auVar27._0_2_;
          sVar2 = auVar27._2_2_;
          sVar3 = auVar27._4_2_;
          sVar4 = auVar27._6_2_;
          *(ulong *)(pUVar12 + lVar17) =
               *(ulong *)(pUVar12 + lVar17) & 0xffffffff00000000 |
               (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar27[6] - (0xff < sVar4),
                               CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar27[4] - (0xff < sVar3),
                                        CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar27[2] -
                                                 (0xff < sVar2),
                                                 (0 < sVar1) * (sVar1 < 0x100) * auVar27[0] -
                                                 (0xff < sVar1))));
        }
        pu1_src = pu1_src + iVar14;
        pu1_dst = pu1_dst + dst_strd * 2;
        pUVar12 = pUVar12 + dst_strd * 2;
        pUVar13 = pUVar13 + iVar14;
      }
      for (lVar17 = 0; (int)lVar17 < wd; lVar17 = lVar17 + 4) {
        auVar27 = *(undefined1 (*) [16])(pu1_src + lVar17 + -3);
        auVar73._0_14_ = auVar27._0_14_;
        auVar73[0xe] = auVar27[7];
        auVar73[0xf] = auVar27[8];
        auVar102._14_2_ = auVar73._14_2_;
        auVar102._0_13_ = auVar27._0_13_;
        auVar102[0xd] = auVar27[7];
        auVar72._13_3_ = auVar102._13_3_;
        auVar72._0_12_ = auVar27._0_12_;
        auVar72[0xc] = auVar27[6];
        auVar71._12_4_ = auVar72._12_4_;
        auVar71._0_11_ = auVar27._0_11_;
        auVar71[0xb] = auVar27[6];
        auVar70._11_5_ = auVar71._11_5_;
        auVar70._0_10_ = auVar27._0_10_;
        auVar70[10] = auVar27[5];
        auVar69._10_6_ = auVar70._10_6_;
        auVar69._0_9_ = auVar27._0_9_;
        auVar69[9] = auVar27[5];
        auVar32._9_7_ = auVar69._9_7_;
        auVar32._0_8_ = auVar27._0_8_;
        auVar32[8] = auVar27[4];
        auVar83._8_8_ = auVar32._8_8_;
        auVar83[7] = auVar27[4];
        auVar83[6] = auVar27[3];
        auVar83[5] = auVar27[3];
        auVar83[4] = auVar27[2];
        auVar83[3] = auVar27[2];
        auVar68._0_2_ = auVar27._0_2_;
        auVar83[2] = auVar27[1];
        auVar83._0_2_ = auVar68._0_2_;
        auVar68._2_14_ = auVar83._2_14_;
        auVar83 = pmaddubsw(auVar68,auVar19);
        auVar29 = pshufb(auVar27,auVar9);
        auVar32 = pmaddubsw(auVar29,auVar20);
        auVar29 = pshufb(auVar27,auVar10);
        auVar102 = pmaddubsw(auVar29,auVar21);
        auVar27 = pshufb(auVar27,auVar11);
        auVar27 = pmaddubsw(auVar27,auVar18);
        auVar29._0_2_ = auVar27._0_2_ + auVar102._0_2_ + auVar32._0_2_ + auVar83._0_2_;
        auVar29._2_2_ = auVar27._2_2_ + auVar102._2_2_ + auVar32._2_2_ + auVar83._2_2_;
        auVar29._4_2_ = auVar27._4_2_ + auVar102._4_2_ + auVar32._4_2_ + auVar83._4_2_;
        auVar29._6_2_ = auVar27._6_2_ + auVar102._6_2_ + auVar32._6_2_ + auVar83._6_2_;
        auVar29._8_2_ = auVar27._8_2_ + auVar102._8_2_ + auVar32._8_2_ + auVar83._8_2_;
        auVar29._10_2_ = auVar27._10_2_ + auVar102._10_2_ + auVar32._10_2_ + auVar83._10_2_;
        auVar29._12_2_ = auVar27._12_2_ + auVar102._12_2_ + auVar32._12_2_ + auVar83._12_2_;
        auVar29._14_2_ = auVar27._14_2_ + auVar102._14_2_ + auVar32._14_2_ + auVar83._14_2_;
        auVar27 = paddsw(auVar29,auVar22);
        auVar27 = psraw(auVar27,6);
        sVar1 = auVar27._0_2_;
        sVar2 = auVar27._2_2_;
        sVar3 = auVar27._4_2_;
        sVar4 = auVar27._6_2_;
        *(ulong *)(pu1_dst + lVar17) =
             *(ulong *)(pu1_dst + lVar17) & 0xffffffff00000000 |
             (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar27[6] - (0xff < sVar4),
                             CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar27[4] - (0xff < sVar3),
                                      CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar27[2] -
                                               (0xff < sVar2),
                                               (0 < sVar1) * (sVar1 < 0x100) * auVar27[0] -
                                               (0xff < sVar1))));
      }
    }
    return;
  }
  __assert_fail("(wd % 4 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                ,0x11a,
                "void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *pu1_src,
                                      UWORD8 *pu1_dst,
                                      WORD32 src_strd,
                                      WORD32 dst_strd,
                                      WORD8 *pi1_coeff,
                                      WORD32 ht,
                                      WORD32 wd)
{
    WORD32 row, col;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b, res_temp8_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b, res_temp18_8x16b;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

    ASSERT(wd % 4 == 0); /* checking assumption*/

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    /* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);
    zero_8x16b = _mm_set1_epi32(0);
    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */

    mask_low_32b = _mm_cmpeq_epi16(zero_8x16b, zero_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_4_8x16b);  /* pi1_coeff[4] */

    if(0 == (ht & 1)) /* ht multiple of 2 case */
    {

        if(0 == (wd & 7)) /* wd = multiple of 8 case */
        {
            for(row = 0; row < ht; row += 2)
            {

                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from row 0*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));         /* row = 0 */

                    /*load 16 pixel values from row 1*/
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row =1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row =1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* pointer updates*/
                pu1_dst += 2 * dst_strd;  /* pointer updates*/
            }
        }
        else /* wd = multiple of 4 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
        }
    }
    else /* odd ht */
    {
        if(0 == (wd & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row++)
            {
                int offset = 0;


                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += src_strd;    /* pointer updates*/
                pu1_dst += dst_strd;    /* pointer updates*/
            }
        }
        else  /* wd = multiple of 4 case */
        {
            for(row = 0; row < (ht - 1); row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
            { /* last repeat at outside the loop */
                int offset = 0;
                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 4; /* To pointer updates*/
                }
            }
        }
    }
}